

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int create_course(course *course,course_strings *data)

{
  int iVar1;
  class_type cVar2;
  int local_24;
  int ret;
  int val;
  course_strings *data_local;
  course *course_local;
  
  course->course_name = data->course_name;
  course->co_requisites = data->co_requisites;
  course->instructor = data->instructor;
  course->pre_requisites = data->pre_requisites;
  course->course_id = data->course_id;
  _ret = data;
  data_local = (course_strings *)course;
  iVar1 = parse_int(&local_24,data->units);
  if (iVar1 == 0) {
    *(char *)&data_local->course_id = (char)local_24;
    iVar1 = parse_int(&local_24,_ret->max_enroll);
    if (iVar1 == 0) {
      *(short *)&data_local->days = (short)local_24;
      iVar1 = parse_final_exam((course *)data_local,_ret->final_exam);
      if (iVar1 == 0) {
        iVar1 = parse_course_id((subject_area *)data_local,&data_local->co_requisites,
                                _ret->course_id);
        if (iVar1 == 0) {
          cVar2 = parse_class_type(_ret->class_type);
          *(class_type *)&data_local->final_exam = cVar2;
          iVar1 = parse_days((_Bool *)((long)&data_local->final_exam + 4),_ret->days);
          if (iVar1 == 0) {
            iVar1 = parse_times((course *)data_local,_ret->times);
            if (iVar1 == 0) {
              iVar1 = parse_int(&local_24,_ret->available_seats);
              if (iVar1 == 0) {
                *(short *)((long)&data_local->class_type + 6) = (short)local_24;
                iVar1 = parse_course_status((course_status *)((long)&data_local->days + 4),
                                            _ret->course_status);
                if (iVar1 == 0) {
                  iVar1 = parse_int(&local_24,_ret->section_number);
                  if (iVar1 == 0) {
                    *(short *)&data_local->instructor = (short)local_24;
                    iVar1 = parse_int(&local_24,_ret->call_number);
                    if (iVar1 == 0) {
                      *(int *)((long)&data_local->instructor + 4) = local_24;
                      course_local._4_4_ = 0;
                    }
                    else {
                      course_local._4_4_ = -1;
                    }
                  }
                  else {
                    course_local._4_4_ = -1;
                  }
                }
                else {
                  course_local._4_4_ = -1;
                }
              }
              else {
                course_local._4_4_ = -1;
              }
            }
            else {
              course_local._4_4_ = -1;
            }
          }
          else {
            course_local._4_4_ = -1;
          }
        }
        else {
          course_local._4_4_ = -1;
        }
      }
      else {
        course_local._4_4_ = -1;
      }
    }
    else {
      course_local._4_4_ = -1;
    }
  }
  else {
    course_local._4_4_ = -1;
  }
  return course_local._4_4_;
}

Assistant:

int create_course(struct course *course, const struct course_strings *data)
{
	int val, ret;

	course->course_name = data->course_name;
	course->co_requisites = data->co_requisites;
	course->instructor = data->instructor;
	course->pre_requisites = data->pre_requisites;
	course->course_id = data->course_id;

	ret = parse_int(&val, data->units);
	if (ret) return -1;
	course->units = val;

	ret = parse_int(&val, data->max_enroll);
	if (ret) return -1;
	course->max_enrollment = val;

	ret = parse_final_exam(course, data->final_exam);
	if (ret) return -1;

	ret = parse_course_id(&course->subject_area, &course->course_number, data->course_id);
	if (ret) return -1;

	course->class_type = parse_class_type(data->class_type);

	ret = parse_days(course->days, data->days);
	if (ret) return -1;

	ret = parse_times(course, data->times);
	if (ret) return -1;

	ret = parse_int(&val, data->available_seats);
	if (ret) return -1;
	course->available_seats = val;

	ret = parse_course_status(&course->status, data->course_status);
	if (ret) return -1;

	ret = parse_int(&val, data->section_number);
	if (ret) return -1;
	course->section = val;

	ret = parse_int(&val, data->call_number);
	if (ret) return -1;
	course->call_number = val;

	return 0;
}